

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

Node * YAML::Clone(Node *node)

{
  NodeBuilder *in_RDI;
  NodeBuilder builder;
  NodeEvents events;
  Node *in_stack_ffffffffffffff38;
  NodeEvents *in_stack_ffffffffffffff40;
  NodeBuilder *in_stack_ffffffffffffff58;
  NodeBuilder *in_stack_ffffffffffffff70;
  EventHandler *in_stack_ffffffffffffff78;
  NodeEvents *in_stack_ffffffffffffff80;
  
  NodeEvents::NodeEvents(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  NodeBuilder::NodeBuilder(in_stack_ffffffffffffff70);
  NodeEvents::Emit(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  NodeBuilder::Root(in_stack_ffffffffffffff58);
  NodeBuilder::~NodeBuilder(in_RDI);
  NodeEvents::~NodeEvents((NodeEvents *)in_RDI);
  return (Node *)in_RDI;
}

Assistant:

Node Clone(const Node& node) {
  NodeEvents events(node);
  NodeBuilder builder;
  events.Emit(builder);
  return builder.Root();
}